

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O1

string * __thiscall
SSTableCache::get_abi_cxx11_(string *__return_storage_ptr__,SSTableCache *this,uint64_t key)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  difference_type __d;
  ulong uVar5;
  char *__s;
  size_t sVar6;
  runtime_error *this_00;
  long *plVar7;
  long *plVar8;
  pointer ppVar9;
  long lVar10;
  ifstream in;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  if ((((this->header).minKey <= key) && (key <= (this->header).maxKey)) &&
     (bVar4 = BloomFilter::exists(&this->bloomFilter,key), bVar4)) {
    ppVar9 = (this->index).
             super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->index).
                  super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + (-0x10 - (long)ppVar9) >> 4;
    while (uVar3 = uVar5, 0 < (long)uVar3) {
      uVar5 = uVar3 >> 1;
      if (ppVar9[uVar5].first < key) {
        ppVar9 = ppVar9 + uVar5 + 1;
        uVar5 = ~uVar5 + uVar3;
      }
    }
    if (ppVar9->first == key) {
      std::ifstream::ifstream(local_238,(string *)&this->fileName,_S_in|_S_bin);
      if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
        iVar1 = ppVar9->second;
        iVar2 = ppVar9[1].second;
        std::istream::seekg((long)local_238,iVar1 + (int)(this->header).length * 0xc + 0x282c);
        lVar10 = (long)iVar2 - (long)iVar1;
        __s = (char *)operator_new__(lVar10 + 1);
        std::istream::read((char *)local_238,(long)__s);
        __s[lVar10] = '\0';
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        sVar6 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,__s,__s + sVar6);
        operator_delete__(__s);
        std::ifstream::close();
        std::ifstream::~ifstream(local_238);
        return __return_storage_ptr__;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_258,"readDic: Open file ",&this->fileName);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_278 = (long *)*plVar7;
      plVar8 = plVar7 + 2;
      if (local_278 == plVar8) {
        local_268 = *plVar8;
        lStack_260 = plVar7[3];
        local_278 = &local_268;
      }
      else {
        local_268 = *plVar8;
      }
      local_270 = plVar7[1];
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_278);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

string SSTableCache::get(uint64_t key) const {
  if (!(header.minKey <= key && key <= header.maxKey)) return "";
  if (!bloomFilter.exists(key)) return "";
  auto cmp = [](SSTableIndex left, uint64_t key) { return left.first < key; };
  auto low = lower_bound(index.begin(), index.end() - 1, key, cmp);
  if (low->first != key) return "";

  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readDic: Open file " + fileName + " failed!");

  auto offset = low->second;
  low++;
  int valueSize;
  valueSize = low->second - offset;

  in.seekg(10272 + (header.length + 1) * 12 + offset, ifstream::beg);

  char *buf = new char[valueSize + 1];
  in.read(buf, valueSize);
  buf[valueSize] = '\0';
  string value(buf);
  delete[] buf;

  in.close();
  return value;
}